

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void transpose64(word *A)

{
  ulong uVar1;
  ulong local_28;
  word m;
  word t;
  int k;
  int j;
  word *A_local;
  
  local_28 = 0xffffffff;
  t._4_4_ = 0x20;
  while (t._4_4_ != 0) {
    for (t._0_4_ = 0; (int)(uint)t < 0x40; t._0_4_ = (uint)t + t._4_4_ + 1 & (t._4_4_ ^ 0xffffffff))
    {
      uVar1 = (A[(int)(uint)t] ^ A[(int)((uint)t + t._4_4_)] >> (sbyte)t._4_4_) & local_28;
      A[(int)(uint)t] = A[(int)(uint)t] ^ uVar1;
      A[(int)((uint)t + t._4_4_)] = A[(int)((uint)t + t._4_4_)] ^ uVar1 << (sbyte)t._4_4_;
    }
    t._4_4_ = (int)t._4_4_ >> 1;
    local_28 = local_28 ^ local_28 << (sbyte)t._4_4_;
  }
  return;
}

Assistant:

static inline void transpose64( word A[64] )
{
    int j, k;
    word t, m = 0x00000000FFFFFFFF;
    for ( j = 32; j != 0; j = j >> 1, m = m ^ (m << j) )
    {
        for ( k = 0; k < 64; k = (k + j + 1) & ~j )
        {
            t = (A[k] ^ (A[k+j] >> j)) & m;
            A[k] = A[k] ^ t;
            A[k+j] = A[k+j] ^ (t << j);
        }
    }
}